

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.cpp
# Opt level: O0

Expected<llvm::DWARFDebugRnglistTable> *
parseRngListTableHeader
          (Expected<llvm::DWARFDebugRnglistTable> *__return_storage_ptr__,DWARFDataExtractor *DA,
          uint64_t Offset,DwarfFormat Format)

{
  byte bVar1;
  bool bVar2;
  error_code EC;
  Error local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined1 local_f8 [8];
  Error E;
  DWARFDebugRnglistTable Table;
  error_code local_48;
  Error local_38;
  ulong local_30;
  uint64_t HeaderSize;
  uint64_t uStack_20;
  DwarfFormat Format_local;
  uint64_t Offset_local;
  DWARFDataExtractor *DA_local;
  
  HeaderSize._7_1_ = Format;
  uStack_20 = Offset;
  Offset_local = (uint64_t)DA;
  DA_local = (DWARFDataExtractor *)__return_storage_ptr__;
  if (Offset != 0) {
    bVar1 = llvm::DWARFListTableHeader::getHeaderSize(Format);
    local_30 = (ulong)bVar1;
    if (uStack_20 < local_30) {
      std::error_code::error_code<llvm::errc,void>(&local_48,invalid_argument);
      EC._M_cat._0_4_ = local_48._M_value;
      EC._0_8_ = &local_38;
      EC._M_cat._4_4_ = 0;
      llvm::createStringError<unsigned_long>
                (EC,(char *)local_48._M_cat,
                 (unsigned_long *)"Did not detect a valid range list table with base = 0x%lx\n");
      llvm::Expected<llvm::DWARFDebugRnglistTable>::Expected(__return_storage_ptr__,&local_38);
      llvm::Error::~Error(&local_38);
      return __return_storage_ptr__;
    }
    uStack_20 = uStack_20 - local_30;
  }
  llvm::DWARFDebugRnglistTable::DWARFDebugRnglistTable((DWARFDebugRnglistTable *)&E);
  local_108 = *(undefined8 *)(Offset_local + 0x20);
  local_128 = *(undefined8 *)Offset_local;
  uStack_120 = *(undefined8 *)(Offset_local + 8);
  local_118 = *(undefined8 *)(Offset_local + 0x10);
  uStack_110 = *(undefined8 *)(Offset_local + 0x18);
  llvm::DWARFListTableBase<llvm::DWARFDebugRnglist>::extractHeaderAndOffsets
            ((DWARFListTableBase<llvm::DWARFDebugRnglist> *)local_f8,
             *(DWARFDataExtractor *)Offset_local,(uint64_t *)&E);
  bVar2 = llvm::Error::operator_cast_to_bool((Error *)local_f8);
  if (bVar2) {
    llvm::Error::Error(&local_130,(Error *)local_f8);
    llvm::Expected<llvm::DWARFDebugRnglistTable>::Expected(__return_storage_ptr__,&local_130);
    llvm::Error::~Error(&local_130);
  }
  llvm::Error::~Error((Error *)local_f8);
  if (!bVar2) {
    llvm::Expected<llvm::DWARFDebugRnglistTable>::Expected<llvm::DWARFDebugRnglistTable>
              (__return_storage_ptr__,(DWARFDebugRnglistTable *)&E,(type *)0x0);
  }
  llvm::DWARFDebugRnglistTable::~DWARFDebugRnglistTable((DWARFDebugRnglistTable *)&E);
  return __return_storage_ptr__;
}

Assistant:

static Expected<DWARFDebugRnglistTable>
parseRngListTableHeader(DWARFDataExtractor &DA, uint64_t Offset,
                        DwarfFormat Format) {
  // We are expected to be called with Offset 0 or pointing just past the table
  // header. Correct Offset in the latter case so that it points to the start
  // of the header.
  if (Offset > 0) {
    uint64_t HeaderSize = DWARFListTableHeader::getHeaderSize(Format);
    if (Offset < HeaderSize)
      return createStringError(errc::invalid_argument, "Did not detect a valid"
                               " range list table with base = 0x%" PRIx64 "\n",
                               Offset);
    Offset -= HeaderSize;
  }
  llvm::DWARFDebugRnglistTable Table;
  if (Error E = Table.extractHeaderAndOffsets(DA, &Offset))
    return std::move(E);
  return Table;
}